

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
::Unordered_set_column
          (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
           *this,Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
                 *column)

{
  Zp_field_operators<unsigned_int,_void> *pZVar1;
  New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>
  *pNVar2;
  void *local_28;
  void *local_20;
  Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  *local_18;
  Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  *column_local;
  Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  *this_local;
  
  local_18 = column;
  column_local = this;
  Column_dimension_holder<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  ::Column_dimension_holder
            (&this->super_Column_dimension_option,&column->super_Column_dimension_option);
  Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  ::Chain_column_extra_properties
            (&this->super_Chain_column_option,&local_18->super_Chain_column_option);
  std::
  unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>_>
  ::unordered_set(&this->column_,&local_18->column_);
  local_20 = (void *)0x0;
  pZVar1 = std::
           exchange<Gudhi::persistence_fields::Zp_field_operators<unsigned_int,void>*,decltype(nullptr)>
                     (&local_18->operators_,&local_20);
  this->operators_ = pZVar1;
  local_28 = (void *)0x0;
  pNVar2 = std::
           exchange<Gudhi::persistence_matrix::New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>*,decltype(nullptr)>
                     (&local_18->entryPool_,&local_28);
  this->entryPool_ = pNVar2;
  return;
}

Assistant:

inline Unordered_set_column<Master_matrix>::Unordered_set_column(Unordered_set_column&& column) noexcept
    : RA_opt(std::move(static_cast<RA_opt&>(column))),
      Dim_opt(std::move(static_cast<Dim_opt&>(column))),
      Chain_opt(std::move(static_cast<Chain_opt&>(column))),
      column_(std::move(column.column_)),
      operators_(std::exchange(column.operators_, nullptr)),
      entryPool_(std::exchange(column.entryPool_, nullptr))
{}